

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_safe_frame.cpp
# Opt level: O2

bool __thiscall ON_SafeFrame::operator==(ON_SafeFrame *this,ON_SafeFrame *sf)

{
  int iVar1;
  int iVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  
  iVar1 = (*this->_vptr_ON_SafeFrame[5])();
  iVar2 = (*sf->_vptr_ON_SafeFrame[5])(sf);
  if ((char)iVar1 == (char)iVar2) {
    iVar1 = (*this->_vptr_ON_SafeFrame[7])(this);
    iVar2 = (*sf->_vptr_ON_SafeFrame[7])(sf);
    if ((char)iVar1 == (char)iVar2) {
      iVar1 = (*this->_vptr_ON_SafeFrame[9])(this);
      iVar2 = (*sf->_vptr_ON_SafeFrame[9])(sf);
      if ((char)iVar1 == (char)iVar2) {
        iVar1 = (*this->_vptr_ON_SafeFrame[0xb])(this);
        iVar2 = (*sf->_vptr_ON_SafeFrame[0xb])(sf);
        if ((char)iVar1 == (char)iVar2) {
          iVar1 = (*this->_vptr_ON_SafeFrame[0xd])(this);
          iVar2 = (*sf->_vptr_ON_SafeFrame[0xd])(sf);
          if ((char)iVar1 == (char)iVar2) {
            iVar1 = (*this->_vptr_ON_SafeFrame[0xf])(this);
            iVar2 = (*sf->_vptr_ON_SafeFrame[0xf])(sf);
            if ((char)iVar1 == (char)iVar2) {
              iVar1 = (*this->_vptr_ON_SafeFrame[0x15])(this);
              iVar2 = (*sf->_vptr_ON_SafeFrame[0x15])(sf);
              if ((char)iVar1 == (char)iVar2) {
                iVar1 = (*this->_vptr_ON_SafeFrame[0x17])(this);
                iVar2 = (*sf->_vptr_ON_SafeFrame[0x17])(sf);
                if ((char)iVar1 == (char)iVar2) {
                  (*this->_vptr_ON_SafeFrame[0x11])(this);
                  (*sf->_vptr_ON_SafeFrame[0x11])(sf);
                  if (ABS(extraout_XMM0_Qa - extraout_XMM0_Qa_00) < 1e-10) {
                    (*this->_vptr_ON_SafeFrame[0x13])(this);
                    (*sf->_vptr_ON_SafeFrame[0x13])(sf);
                    if (ABS(extraout_XMM0_Qa_01 - extraout_XMM0_Qa_02) < 1e-10) {
                      (*this->_vptr_ON_SafeFrame[0x19])(this);
                      (*sf->_vptr_ON_SafeFrame[0x19])(sf);
                      if (ABS(extraout_XMM0_Qa_03 - extraout_XMM0_Qa_04) < 1e-10) {
                        (*this->_vptr_ON_SafeFrame[0x1b])(this);
                        (*sf->_vptr_ON_SafeFrame[0x1b])(sf);
                        return ABS(extraout_XMM0_Qa_05 - extraout_XMM0_Qa_06) < 1e-10;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_SafeFrame::operator == (const ON_SafeFrame& sf) const
{
  if (Enabled()           != sf.Enabled())           return false;
  if (PerspectiveOnly()   != sf.PerspectiveOnly())   return false;
  if (FieldGridOn()       != sf.FieldGridOn())       return false;
  if (LiveFrameOn()       != sf.LiveFrameOn())       return false;
  if (ActionFrameOn()     != sf.ActionFrameOn())     return false;
  if (ActionFrameLinked() != sf.ActionFrameLinked()) return false;
  if (TitleFrameOn()      != sf.TitleFrameOn())      return false;
  if (TitleFrameLinked()  != sf.TitleFrameLinked())  return false;

  if (!IsDoubleEqual(ActionFrameXScale(), sf.ActionFrameXScale())) return false;
  if (!IsDoubleEqual(ActionFrameYScale(), sf.ActionFrameYScale())) return false;
  if (!IsDoubleEqual(TitleFrameXScale() , sf.TitleFrameXScale())) return false;
  if (!IsDoubleEqual(TitleFrameYScale() , sf.TitleFrameYScale())) return false;

  return true;
}